

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_has_more_data(bitstream *str)

{
  byte bVar1;
  int local_20;
  uint local_1c;
  int offs;
  int byte;
  bitstream *str_local;
  
  if (str->dir == VS_ENCODE) {
    fprintf(_stderr,"vs_has_more_data called in encode mode\n");
    str_local._4_4_ = -1;
  }
  else {
    local_20 = 0;
    if (str->type == VS_H262) {
      if ((str->hasbyte != 0) &&
         (((1 << ((char)str->bitpos + 1U & 0x1f)) - 1U & (uint)str->curbyte) != 0)) {
        return 1;
      }
    }
    else {
      if (str->type != VS_H264) {
        abort();
      }
      if (str->hasbyte == 0) {
        if (str->bytepos == str->bytesnum) {
          fprintf(_stderr,"no RBSP trailer byte\n");
          return -1;
        }
        local_20 = 1;
        bVar1 = str->bytes[str->bytepos];
      }
      else {
        bVar1 = str->curbyte;
        local_20 = 0;
      }
      local_1c = (uint)bVar1;
      if (((1 << ((char)str->bitpos + 1U & 0x1f)) - 1U & local_1c) !=
          1 << ((byte)str->bitpos & 0x1f)) {
        return 1;
      }
    }
    local_20 = str->bytepos + local_20;
    if ((local_20 < str->bytesnum) && (str->bytes[local_20] != '\0')) {
      str_local._4_4_ = 1;
    }
    else if ((local_20 + 1 < str->bytesnum) && (str->bytes[local_20 + 1] != '\0')) {
      str_local._4_4_ = 1;
    }
    else if ((local_20 + 2 < str->bytesnum) && (2 < str->bytes[local_20 + 2])) {
      str_local._4_4_ = 1;
    }
    else {
      str_local._4_4_ = 0;
    }
  }
  return str_local._4_4_;
}

Assistant:

int vs_has_more_data(struct bitstream *str) {
	if (str->dir == VS_ENCODE) {
		fprintf (stderr, "vs_has_more_data called in encode mode\n");
		return -1;
	}
	int byte;
	int offs = 0;
	switch (str->type) {
		case VS_H264:
			if (!str->hasbyte) {
				if (str->bytepos == str->bytesnum) {
					fprintf (stderr, "no RBSP trailer byte\n");
					return -1;
				}
				offs = 1;
				byte = str->bytes[str->bytepos];
			} else {
				byte = str->curbyte;
				offs = 0;
			}
			byte &= (1 << (str->bitpos+1)) - 1;
			if (byte != (1 << str->bitpos))
				return 1;
			break;
		case VS_H262:
			byte = str->curbyte;
			byte &= (1 << (str->bitpos+1)) - 1;
			if (str->hasbyte && byte)
				return 1;
			break;
		default:
			abort();
	}
	offs += str->bytepos;
	if (offs < str->bytesnum && str->bytes[offs])
		return 1;
	if (offs+1 < str->bytesnum && str->bytes[offs+1])
		return 1;
	if (offs+2 < str->bytesnum && str->bytes[offs+2] > 2)
		return 1;
	/* followed by 00 00 00 or 00 00 01 or 00* EOF */
	return 0;

}